

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O3

void VP8WriteProbas(VP8BitWriter *bw,VP8EncProba *probas)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint8_t (*paaauVar6) [8] [3] [11];
  uint8_t (*pauVar7) [11];
  uint8_t (*pauVar8) [11];
  uint8_t (*paaauVar9) [8] [3] [11];
  uint8_t (*pauVar10) [11];
  uint8_t (*pauVar11) [11];
  ProbaArray (*paaauVar12) [8];
  ProbaArray (*paaauVar13) [8];
  ProbaArray (*paaauVar14) [8];
  long lVar15;
  
  paaauVar12 = probas->coeffs_;
  paaauVar6 = VP8CoeffsProba0;
  paaauVar9 = VP8CoeffsUpdateProba;
  lVar5 = 0;
  do {
    lVar4 = 0;
    pauVar7 = (uint8_t (*) [11])paaauVar6;
    pauVar10 = (uint8_t (*) [11])paaauVar9;
    paaauVar13 = paaauVar12;
    do {
      lVar3 = 0;
      pauVar8 = pauVar7;
      pauVar11 = pauVar10;
      paaauVar14 = paaauVar13;
      do {
        lVar15 = 0;
        do {
          bVar1 = (*paaauVar14)[0][0][lVar15];
          iVar2 = VP8PutBit(bw,(uint)(bVar1 != (*(uint8_t (*) [3] [11])*pauVar8)[0][lVar15]),
                            (uint)(*(uint8_t (*) [3] [11])*pauVar11)[0][lVar15]);
          if (iVar2 != 0) {
            VP8PutBits(bw,(uint)bVar1,8);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0xb);
        lVar3 = lVar3 + 1;
        paaauVar14 = (ProbaArray (*) [8])((*paaauVar14)[0] + 1);
        pauVar8 = pauVar8 + 1;
        pauVar11 = pauVar11 + 1;
      } while (lVar3 != 3);
      lVar4 = lVar4 + 1;
      paaauVar13 = (ProbaArray (*) [8])(*paaauVar13 + 1);
      pauVar7 = pauVar7 + 3;
      pauVar10 = pauVar10 + 3;
    } while (lVar4 != 8);
    lVar5 = lVar5 + 1;
    paaauVar12 = paaauVar12 + 1;
    paaauVar6 = (uint8_t (*) [8] [3] [11])((long)paaauVar6 + 0x108);
    paaauVar9 = (uint8_t (*) [8] [3] [11])((long)paaauVar9 + 0x108);
  } while (lVar5 != 4);
  iVar2 = VP8PutBitUniform(bw,probas->use_skip_proba_);
  if (iVar2 != 0) {
    VP8PutBits(bw,(uint)probas->skip_proba_,8);
    return;
  }
  return;
}

Assistant:

void VP8WriteProbas(VP8BitWriter* const bw, const VP8EncProba* const probas) {
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const uint8_t p0 = probas->coeffs_[t][b][c][p];
          const int update = (p0 != VP8CoeffsProba0[t][b][c][p]);
          if (VP8PutBit(bw, update, VP8CoeffsUpdateProba[t][b][c][p])) {
            VP8PutBits(bw, p0, 8);
          }
        }
      }
    }
  }
  if (VP8PutBitUniform(bw, probas->use_skip_proba_)) {
    VP8PutBits(bw, probas->skip_proba_, 8);
  }
}